

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

string * common_chat_format_example_abi_cxx11_(common_chat_templates *tmpls,bool use_jinja)

{
  common_chat_params *in_RDI;
  anon_class_8_1_5a939327 add_simple_msg;
  common_chat_templates_inputs inputs;
  common_chat_params *tmpls_00;
  string asStack_140 [160];
  undefined1 *local_a0;
  undefined1 local_98 [24];
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  anon_class_8_1_5a939327 *in_stack_ffffffffffffff90;
  
  tmpls_00 = in_RDI;
  common_chat_templates_inputs::common_chat_templates_inputs((common_chat_templates_inputs *)in_RDI)
  ;
  local_a0 = local_98;
  common_chat_format_example[abi:cxx11](common_chat_templates_const*,bool)::$_0::operator()
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  common_chat_format_example[abi:cxx11](common_chat_templates_const*,bool)::$_0::operator()
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  common_chat_format_example[abi:cxx11](common_chat_templates_const*,bool)::$_0::operator()
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  common_chat_format_example[abi:cxx11](common_chat_templates_const*,bool)::$_0::operator()
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  common_chat_templates_apply
            ((common_chat_templates *)tmpls_00,(common_chat_templates_inputs *)in_RDI);
  std::__cxx11::string::string((string *)in_RDI,asStack_140);
  common_chat_params::~common_chat_params(in_RDI);
  common_chat_templates_inputs::~common_chat_templates_inputs
            ((common_chat_templates_inputs *)in_RDI);
  return (string *)tmpls_00;
}

Assistant:

std::string common_chat_format_example(const struct common_chat_templates * tmpls, bool use_jinja) {
    common_chat_templates_inputs inputs;
    inputs.use_jinja = use_jinja;
    auto add_simple_msg = [&](auto role, auto content) {
        common_chat_msg msg;
        msg.role = role;
        msg.content = content;
        inputs.messages.push_back(msg);
    };
    add_simple_msg("system",    "You are a helpful assistant");
    add_simple_msg("user",      "Hello");
    add_simple_msg("assistant", "Hi there");
    add_simple_msg("user",      "How are you?");
    return common_chat_templates_apply(tmpls, inputs).prompt;
}